

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader_test.cpp
# Opt level: O3

void __thiscall env_var_not_defined::test_method(env_var_not_defined *this)

{
  bool bVar1;
  AuditEvent *pAVar2;
  undefined1 local_1b8 [32];
  undefined **local_198;
  ulong local_190;
  shared_count sStack_188;
  EVENT_TYPE **local_180;
  long local_178;
  long *local_170;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfos;
  EventRegistry registry;
  EVENT_TYPE *local_130;
  undefined1 local_128 [8];
  undefined8 local_120;
  shared_count sStack_118;
  undefined4 local_10c;
  undefined **local_108;
  char *local_100;
  undefined1 *local_f8;
  char *local_f0;
  LicenseReader licenseReader;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  LicenseLocation location;
  
  location.licenseFileLocation = (char *)0x0;
  location.environmentVariableName = "MYVAR";
  location.openFileNearModule = false;
  license::LicenseReader::LicenseReader(&licenseReader,&location);
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8._0_8_ = local_1b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"PRODUCT","");
  license::LicenseReader::readLicenses(&registry,&licenseReader,(string *)local_1b8,&licenseInfos);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_);
  }
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0x3c);
  bVar1 = license::EventRegistry::isGood(&registry);
  local_198 = (undefined **)CONCAT71(local_198._1_7_,!bVar1);
  local_190 = 0;
  sStack_188.pi_ = (sp_counted_base *)0x0;
  local_1b8._24_8_ = &local_108;
  local_108 = (undefined **)0x47b0f5;
  local_100 = "";
  local_1b8[8] = 0;
  local_1b8._0_8_ = &PTR__lazy_ostream_0059beb0;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_70 = "";
  boost::test_tools::tt_detail::report_assertion(&local_198,local_1b8,&local_78,0x3c,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_188);
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0x3d);
  local_178 = (long)licenseInfos.
                    super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)licenseInfos.
                    super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 8;
  local_128[0] = licenseInfos.
                 super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish ==
                 licenseInfos.
                 super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_100 = (char *)((ulong)local_100 & 0xffffffffffffff00);
  local_108 = &PTR__lazy_ostream_0059bf00;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  local_170 = (long *)&local_10c;
  local_10c = 0;
  local_130 = (EVENT_TYPE *)&local_178;
  local_120 = 0;
  sStack_118.pi_ = (sp_counted_base *)0x0;
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_c0 = "";
  local_1b8._24_8_ = &local_170;
  local_1b8[8] = 0;
  local_1b8._0_8_ = &PTR__lazy_ostream_0059bf40;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_190 = local_190 & 0xffffffffffffff00;
  local_198 = &PTR__lazy_ostream_0059bf80;
  sStack_188.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_180 = &local_130;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_118);
  pAVar2 = license::EventRegistry::getLastFailure(&registry);
  if (pAVar2 != (AuditEvent *)0x0) {
    local_a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
    ;
    local_a0 = "";
    local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a8,0x40);
    local_100 = (char *)((ulong)local_100 & 0xffffffffffffff00);
    local_108 = &PTR__lazy_ostream_0059bf00;
    local_f8 = boost::unit_test::lazy_ostream::inst;
    local_f0 = "";
    local_178 = CONCAT44(local_178._4_4_,3);
    pAVar2 = license::EventRegistry::getLastFailure(&registry);
    local_130 = &pAVar2->event_type;
    local_128[0] = pAVar2->event_type == ENVIRONMENT_VARIABLE_NOT_DEFINED;
    local_120 = 0;
    sStack_118.pi_ = (sp_counted_base *)0x0;
    local_c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
    ;
    local_c0 = "";
    local_170 = &local_178;
    local_1b8[8] = 0;
    local_1b8._0_8_ = &PTR__lazy_ostream_0059bfc0;
    local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_1b8._24_8_ = &local_170;
    local_190 = local_190 & 0xffffffffffffff00;
    local_198 = &PTR__lazy_ostream_0059bfc0;
    sStack_188.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_180 = &local_130;
    boost::test_tools::tt_detail::report_assertion
              (local_128,&local_108,&local_c8,0x40,1,2,2,"ENVIRONMENT_VARIABLE_NOT_DEFINED",
               local_1b8,"registry.getLastFailure()->event_type",&local_198);
    boost::detail::shared_count::~shared_count(&sStack_118);
    if (registry.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(registry.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
              (&licenseInfos);
    license::LicenseReader::~LicenseReader(&licenseReader);
    return;
  }
  __assert_fail("registry.getLastFailure()!=__null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
                ,0x3e,"void env_var_not_defined::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE( env_var_not_defined ) {
	const char * envName = "MYVAR";
	const LicenseLocation location = { NULL, envName, false };
	LicenseReader licenseReader(location);
	vector<FullLicenseInfo> licenseInfos;
	EventRegistry registry = licenseReader.readLicenses("PRODUCT",
			licenseInfos);
	BOOST_CHECK(!registry.isGood());
	BOOST_CHECK_EQUAL(0, licenseInfos.size());
	BOOST_ASSERT(registry.getLastFailure()!=NULL);
	BOOST_CHECK_EQUAL(ENVIRONMENT_VARIABLE_NOT_DEFINED,
			registry.getLastFailure()->event_type);
}